

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseIfExceptHeader(WastParser *this,IfExceptExpr *expr)

{
  bool bVar1;
  Result RVar2;
  string *psVar3;
  long lVar4;
  Enum EVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Var local_e0;
  Location local_98;
  undefined1 local_70 [8];
  Var var;
  
  bVar1 = PeekMatchLpar(this,Result);
  if ((bVar1) || (bVar1 = PeekMatchLpar(this,Param), bVar1)) {
    RVar2 = ParseBlockDeclaration(this,&(expr->true_).decl);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = ParseVar(this,&expr->except_var);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
LAB_00dab67e:
    EVar5 = Ok;
  }
  else {
    bVar1 = PeekMatch(this,Last_Literal);
    if (bVar1) {
      RVar2 = ParseVar(this,&expr->except_var);
joined_r0x00dab7d3:
      if (RVar2.enum_ != Error) goto LAB_00dab67e;
    }
    else {
      bVar1 = PeekMatch(this,Last_String);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)local_70,"a var",(allocator *)((long)&var.field_2 + 0x1d));
        std::__cxx11::string::string
                  ((string *)(var.loc.field_1.field2 + 8),"a block type",
                   (allocator *)((long)&var.field_2 + 0x1e));
        __l._M_len = 2;
        __l._M_array = (iterator)local_70;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,__l,(allocator_type *)((long)&var.field_2 + 0x1f));
        RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_98,"12 or $foo or (result ...)");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        lVar4 = 0x20;
        do {
          std::__cxx11::string::~string((string *)(local_70 + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != -0x20);
        return (Result)RVar2.enum_;
      }
      local_98.field_1.field_0.line = 0;
      local_98.field_1._4_8_ = 0;
      local_98.filename.data_ = (char *)0x0;
      local_98.filename.size_._0_4_ = 0;
      local_98.filename.size_._4_4_ = 0;
      Var::Var((Var *)local_70,0xffffffff,&local_98);
      RVar2 = ParseVar(this,(Var *)local_70);
      if (RVar2.enum_ != Error) {
        bVar1 = PeekMatchLpar(this,Result);
        if ((!bVar1) && (bVar1 = PeekMatchLpar(this,Param), !bVar1)) {
          local_98.field_1.field_0.line = 0;
          local_98.field_1._4_8_ = 0;
          local_98.filename.data_ = (char *)0x0;
          local_98.filename.size_._0_4_ = 0;
          local_98.filename.size_._4_4_ = 0;
          Var::Var(&local_e0,0xffffffff,&local_98);
          bVar1 = ParseVarOpt(this,&expr->except_var,&local_e0);
          Var::~Var(&local_e0);
          if (bVar1) {
            psVar3 = Var::name_abi_cxx11_((Var *)local_70);
            std::__cxx11::string::_M_assign((string *)&expr->true_,(string *)psVar3);
          }
          else {
            Var::operator=(&expr->except_var,(Var *)local_70);
          }
          Var::~Var((Var *)local_70);
          goto LAB_00dab67e;
        }
        psVar3 = Var::name_abi_cxx11_((Var *)local_70);
        std::__cxx11::string::_M_assign((string *)&expr->true_,(string *)psVar3);
        RVar2 = ParseBlockDeclaration(this,&(expr->true_).decl);
        if (RVar2.enum_ != Error) {
          RVar2 = ParseVar(this,&expr->except_var);
          Var::~Var((Var *)local_70);
          goto joined_r0x00dab7d3;
        }
      }
      Var::~Var((Var *)local_70);
    }
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseIfExceptHeader(IfExceptExpr* expr) {
  WABT_TRACE(ParseIfExceptHeader);
  // if_except has the syntax:
  //
  //     if_except label_opt block_type except_index
  //
  // This means that it can have a few different forms:
  //
  //     1. if_except <num> ...
  //     2. if_except $except ...
  //     3. if_except $label $except/<num> ...
  //     4. if_except (result...) $except/<num> ...
  //     5. if_except $label (result...) $except/<num> ...
  //
  // With the multi-value proposal, `block_type` can be (param...) (result...),
  // so there are more forms:
  //
  //     6. if_except (param...) $except/<num> ...
  //     7. if_except (param...) (result...) $except/<num> ...
  //     8. if_except $label (param...) $except/<num> ...
  //     9. if_except $label (param...) (result...) $except/<num> ...
  //
  // This case is handled by ParseBlockDeclaration, but it means we also need
  // to check for the `param` token here.

  if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
    // Cases 4, 6, 7.
    CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Nat)) {
    // Case 1.
    CHECK_RESULT(ParseVar(&expr->except_var));
  } else if (PeekMatch(TokenType::Var)) {
    // Cases 2, 3, 5, 8, 9.
    Var var;
    CHECK_RESULT(ParseVar(&var));
    if (PeekMatchLpar(TokenType::Result) || PeekMatchLpar(TokenType::Param)) {
      // Cases 5, 8, 9.
      expr->true_.label = var.name();
      CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));
      CHECK_RESULT(ParseVar(&expr->except_var));
    } else if (ParseVarOpt(&expr->except_var, Var())) {
      // Case 3.
      expr->true_.label = var.name();
    } else {
      // Case 2.
      expr->except_var = var;
    }
  } else {
    return ErrorExpected({"a var", "a block type"},
                         "12 or $foo or (result ...)");
  }

  return Result::Ok;
}